

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsObject.c
# Opt level: O2

void JsStandardDelete(JsObject *self,char *prop,JsValue *res)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined4 *puVar5;
  int pos;
  bool bVar6;
  
  res->type = JS_BOOLEAN;
  puVar1 = (undefined8 *)*self->sb;
  JsLockup((JsLock)puVar1[2]);
  iVar2 = JsListSize((void *)*puVar1);
  pos = 0;
  if (iVar2 < 1) {
    iVar2 = pos;
  }
  while( true ) {
    if (iVar2 == pos) goto LAB_001050d2;
    puVar4 = (undefined8 *)JsListGet((void *)*puVar1,pos);
    iVar3 = strcmp((char *)*puVar4,prop);
    if (iVar3 == 0) break;
    pos = pos + 1;
  }
  iVar2 = 0;
  if ((*(byte *)(puVar4 + 2) & 4) != 0) goto LAB_001050d6;
  JsListRemove((void *)*puVar1,pos);
  iVar2 = JsListSize((void *)puVar1[1]);
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  while (bVar6 = iVar2 != 0, iVar2 = iVar2 + -1, bVar6) {
    puVar5 = (undefined4 *)JsListGet((void *)puVar1[1],0);
    *puVar5 = 0;
    JsListRemove((void *)puVar1[1],0);
  }
LAB_001050d2:
  iVar2 = 1;
LAB_001050d6:
  JsUnlock((JsLock)puVar1[2]);
  (res->u).boolean = iVar2;
  return;
}

Assistant:

void JsStandardDelete(struct JsObject *self, char *prop,struct JsValue* res){
	int i,size;
	struct JsProperty* p;
	struct JsStandardSelfBlock* sb;
	res->type = JS_BOOLEAN;
	sb = (struct JsStandardSelfBlock*)self->sb[JS_STANDARD_OBJECT_FLOOR];
	JsLockup(sb->lock);
	size = JsListSize(sb->propertys);
	for(i=0;i<size;++i){
		p = (struct JsProperty*)JsListGet(sb->propertys,i);
		if(strcmp(p->name,prop) == 0){
			if(p->attr & JS_OBJECT_ATTR_DONTDELETE){
				JsUnlock(sb->lock);
				res->u.boolean = FALSE;
				return;
			}
			//删除该属性
			JsListRemove(sb->propertys,i);
			//对Iterator做处理
			noticeDel(sb);
			//解锁
			JsUnlock(sb->lock);
			res->u.boolean = TRUE;
			return;
		}
	}
	JsUnlock(sb->lock);	
	res->u.boolean = TRUE;
	return;
}